

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O2

double ** New2DArray<double>(uint f,uint s)

{
  double **ppdVar1;
  double *pdVar2;
  ulong uVar3;
  
  ppdVar1 = (double **)operator_new__((ulong)f * 8);
  pdVar2 = (double *)operator_new__((ulong)(f * s) << 3);
  *ppdVar1 = pdVar2;
  for (uVar3 = 1; pdVar2 = pdVar2 + s, uVar3 < f; uVar3 = uVar3 + 1) {
    ppdVar1[uVar3] = pdVar2;
  }
  return ppdVar1;
}

Assistant:

T **New2DArray(unsigned f , unsigned s)
{
	T **temp;
	temp = new T *[f];
	*temp = new T [f * s];
	for (unsigned fIt = 1 ; fIt < f ; fIt ++)
		temp[fIt] = temp[fIt -1] +  s ;
	return temp;
}